

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_OpenAudio(SDL_AudioSpec *want,SDL_AudioSpec *obtained)

{
  code *pcVar1;
  int iVar2;
  SDL_bool SVar3;
  SDL_AssertState SVar4;
  char *pcVar5;
  bool bVar6;
  uint local_50;
  SDL_AssertState sdl_assert_state;
  Uint32 pow2;
  Uint32 samp;
  char *env_3;
  char *env_2;
  char *env_1;
  char *env;
  SDL_bool already_opened;
  SDL_AudioSpec *obtained_local;
  SDL_AudioSpec *want_local;
  
  if (((InitializedSubsystems20 & 0x10) == 0x10) || (iVar2 = SDL_InitSubSystem(0x10), -1 < iVar2)) {
    if ((want == (SDL_AudioSpec *)0x0) || (want->callback != (SDL_AudioCallback)0x0)) {
      (*SDL20_LockAudio)();
      bVar6 = false;
      if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
        bVar6 = audio_cbdata->app_callback_opened != SDL_FALSE;
      }
      (*SDL20_UnlockAudio)();
      if (bVar6) {
        want_local._4_4_ = (*SDL20_SetError)("Audio device already opened");
      }
      else {
        if (want->format == 0) {
          pcVar5 = (*SDL20_getenv)("SDL_AUDIO_FORMAT");
          if (pcVar5 != (char *)0x0) {
            iVar2 = (*SDL20_strcmp)(pcVar5,"U8");
            if (iVar2 == 0) {
              want->format = 8;
            }
            else {
              iVar2 = (*SDL20_strcmp)(pcVar5,"S8");
              if (iVar2 == 0) {
                want->format = 0x8008;
              }
              else {
                iVar2 = (*SDL20_strcmp)(pcVar5,"U16");
                if (iVar2 == 0) {
                  want->format = 0x10;
                }
                else {
                  iVar2 = (*SDL20_strcmp)(pcVar5,"S16");
                  if (iVar2 == 0) {
                    want->format = 0x8010;
                  }
                  else {
                    iVar2 = (*SDL20_strcmp)(pcVar5,"U16LSB");
                    if (iVar2 == 0) {
                      want->format = 0x10;
                    }
                    else {
                      iVar2 = (*SDL20_strcmp)(pcVar5,"S16LSB");
                      if (iVar2 == 0) {
                        want->format = 0x8010;
                      }
                      else {
                        iVar2 = (*SDL20_strcmp)(pcVar5,"U16MSB");
                        if (iVar2 == 0) {
                          want->format = 0x1010;
                        }
                        else {
                          iVar2 = (*SDL20_strcmp)(pcVar5,"S16MSB");
                          if (iVar2 == 0) {
                            want->format = 0x9010;
                          }
                          else {
                            iVar2 = (*SDL20_strcmp)(pcVar5,"U16SYS");
                            if (iVar2 == 0) {
                              want->format = 0x10;
                            }
                            else {
                              iVar2 = (*SDL20_strcmp)(pcVar5,"S16SYS");
                              if (iVar2 == 0) {
                                want->format = 0x8010;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          if (want->format == 0) {
            want->format = 0x8010;
          }
        }
        if (want->freq == 0) {
          pcVar5 = (*SDL20_getenv)("SDL_AUDIO_FREQUENCY");
          if (pcVar5 != (char *)0x0) {
            iVar2 = SDL20_atoi(pcVar5);
            want->freq = iVar2;
          }
          if (want->freq == 0) {
            want->freq = 0x5622;
          }
          want->samples = 0;
        }
        if (want->channels == '\0') {
          pcVar5 = (*SDL20_getenv)("SDL_AUDIO_CHANNELS");
          if (pcVar5 != (char *)0x0) {
            iVar2 = SDL20_atoi(pcVar5);
            want->channels = (Uint8)iVar2;
          }
          if (want->channels == '\0') {
            want->channels = '\x02';
          }
        }
        if (want->samples == 0) {
          pcVar5 = (*SDL20_getenv)("SDL_AUDIO_SAMPLES");
          if (pcVar5 != (char *)0x0) {
            iVar2 = SDL20_atoi(pcVar5);
            want->samples = (Uint16)iVar2;
          }
          if (want->samples == 0) {
            for (local_50 = 1; local_50 < (uint)((want->freq / 1000) * 0x2e);
                local_50 = local_50 << 1) {
            }
            want->samples = (Uint16)local_50;
          }
        }
        SVar3 = OpenSDL2AudioDevice(want);
        if (SVar3 == SDL_FALSE) {
          want_local._4_4_ = -1;
        }
        else {
          if (obtained != (SDL_AudioSpec *)0x0) {
            (*SDL20_memcpy)(obtained,want,0x20);
          }
          (*SDL20_memcpy)(&audio_cbdata->app_callback_format,want,0x20);
          (*SDL20_AtomicSet)(&audio_callback_paused,1);
          do {
            if (audio_cbdata->app_callback_stream == (SDL_AudioStream *)0x0) goto LAB_00117ed3;
            SVar4 = (*SDL20_ReportAssertion)
                              (&SDL_OpenAudio::sdl_assert_data,"SDL_OpenAudio",
                               "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                               ,0x263c);
          } while (SVar4 == SDL_ASSERTION_RETRY);
          if (SVar4 == SDL_ASSERTION_BREAK) {
            pcVar1 = (code *)swi(3);
            iVar2 = (*pcVar1)();
            return iVar2;
          }
LAB_00117ed3:
          SVar3 = ResetAudioStream(&audio_cbdata->app_callback_stream,
                                   &audio_cbdata->app_callback_format,&audio_cbdata->device_format,
                                   want->format,want->channels,want->freq);
          if (SVar3 == SDL_FALSE) {
            (*SDL20_UnlockAudio)();
            want_local._4_4_ = CloseSDL2AudioDevice();
          }
          else {
            audio_cbdata->app_callback_opened = SDL_TRUE;
            (*SDL20_UnlockAudio)();
            want_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      want_local._4_4_ = (*SDL20_SetError)("Callback can\'t be NULL");
    }
  }
  else {
    want_local._4_4_ = -1;
  }
  return want_local._4_4_;
}

Assistant:

SDLCALL
SDL_OpenAudio(SDL_AudioSpec *want, SDL_AudioSpec *obtained)
{
    SDL_bool already_opened;

    /* SDL_OpenAudio() will init the subsystem for you if necessary, yuck. */
    if ((InitializedSubsystems20 & SDL_INIT_AUDIO) != SDL_INIT_AUDIO) {
        if (SDL_InitSubSystem(SDL12_INIT_AUDIO) < 0) {
            return -1;
        }
    }

    /* SDL2 uses a NULL callback to mean "we plan to use SDL_QueueAudio()" */
    if (want && (want->callback == NULL)) {
        return SDL20_SetError("Callback can't be NULL");
    }

    SDL20_LockAudio();
    already_opened = (audio_cbdata && audio_cbdata->app_callback_opened) ? SDL_TRUE : SDL_FALSE;
    SDL20_UnlockAudio();
    if (already_opened) {
        return SDL20_SetError("Audio device already opened");
    }

    if (!want->format) {
        const char *env = SDL20_getenv("SDL_AUDIO_FORMAT");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            if      (SDL20_strcmp(env, "U8") == 0) { want->format = AUDIO_U8; }
            else if (SDL20_strcmp(env, "S8") == 0) { want->format = AUDIO_S8; }
            else if (SDL20_strcmp(env, "U16") == 0) { want->format = AUDIO_U16SYS; }
            else if (SDL20_strcmp(env, "S16") == 0) { want->format = AUDIO_S16SYS; }
            else if (SDL20_strcmp(env, "U16LSB") == 0) { want->format = AUDIO_U16LSB; }
            else if (SDL20_strcmp(env, "S16LSB") == 0) { want->format = AUDIO_S16LSB; }
            else if (SDL20_strcmp(env, "U16MSB") == 0) { want->format = AUDIO_U16MSB; }
            else if (SDL20_strcmp(env, "S16MSB") == 0) { want->format = AUDIO_S16MSB; }
            else if (SDL20_strcmp(env, "U16SYS") == 0) { want->format = AUDIO_U16SYS; }
            else if (SDL20_strcmp(env, "S16SYS") == 0) { want->format = AUDIO_S16SYS; }
        }
        if (!want->format) {
            want->format = AUDIO_S16SYS;
        }
    }

    if (!want->freq) {
        const char *env = SDL20_getenv("SDL_AUDIO_FREQUENCY");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            want->freq = SDL20_atoi(env);
        }
        if (!want->freq) {
            want->freq = 22050;
        }
        want->samples = 0;
    }

    if (!want->channels) {
        const char *env = SDL20_getenv("SDL_AUDIO_CHANNELS");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            want->channels = SDL20_atoi(env);
        }
        if (!want->channels) {
            want->channels = 2;
        }
    }

    if (!want->samples) {
        const char *env = SDL20_getenv("SDL_AUDIO_SAMPLES");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            want->samples = SDL20_atoi(env);
        }
        if (!want->samples) {
            const Uint32 samp = (want->freq / 1000) * 46;  /* ~46 ms */
            Uint32 pow2 = 1;
            while (pow2 < samp) {
                pow2 <<= 1;
            }
            want->samples = pow2;
        }
    }

    /* the app always passes callback data through an SDL_AudioStream, since it
       has to share with the fake CD-ROM support. This also avoids the risk of
       getting an incompatible device configuration from SDL2. As such,
       the app always gets the format it requests. */
    if (!OpenSDL2AudioDevice(want)) {
        return -1;
    }

    /* Device is locked now, unconditionally. Set up some things. */

    if (obtained) {  /* the app always gets the format it requests */
        SDL20_memcpy(obtained, want, sizeof (SDL_AudioSpec));
    }

    SDL20_memcpy(&audio_cbdata->app_callback_format, want, sizeof (SDL_AudioSpec));
    SDL20_AtomicSet(&audio_callback_paused, SDL_TRUE);  /* app callback always starts paused after open. */

    SDL_assert(audio_cbdata->app_callback_stream == NULL);
    if (!ResetAudioStream(&audio_cbdata->app_callback_stream, &audio_cbdata->app_callback_format, &audio_cbdata->device_format, want->format, want->channels, want->freq)) {
        SDL20_UnlockAudio();  /* make sure CD audio doesn't hang if it's playing. */
        return CloseSDL2AudioDevice();  /* will stay open if CD audio is still playing, cleans up otherwise. */
    }

    audio_cbdata->app_callback_opened = SDL_TRUE;

    SDL20_UnlockAudio();  /* we're off and going. */

    return 0;
}